

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O0

void rlPopMatrix(void)

{
  undefined1 local_48 [8];
  Matrix mat;
  
  if (0 < RLGL.State.stackCounter) {
    memcpy(local_48,RLGL.State.stack + (RLGL.State.stackCounter + -1),0x40);
    memcpy(RLGL.State.currentMatrix,local_48,0x40);
    RLGL.State.stackCounter = RLGL.State.stackCounter + -1;
  }
  if ((RLGL.State.stackCounter == 0) && (RLGL.State.currentMatrixMode == 0x1700)) {
    RLGL.State.currentMatrix = &RLGL.State.modelview;
    RLGL.State.transformRequired = false;
  }
  return;
}

Assistant:

void rlPopMatrix(void)
{
    if (RLGL.State.stackCounter > 0)
    {
        Matrix mat = RLGL.State.stack[RLGL.State.stackCounter - 1];
        *RLGL.State.currentMatrix = mat;
        RLGL.State.stackCounter--;
    }

    if ((RLGL.State.stackCounter == 0) && (RLGL.State.currentMatrixMode == RL_MODELVIEW))
    {
        RLGL.State.currentMatrix = &RLGL.State.modelview;
        RLGL.State.transformRequired = false;
    }
}